

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PopClipRect(ImDrawList *this)

{
  long in_RDI;
  ImDrawList *unaff_retaddr;
  undefined8 *local_18;
  
  ImVector<ImVec4>::pop_back((ImVector<ImVec4> *)(in_RDI + 0x58));
  if (*(int *)(in_RDI + 0x58) == 0) {
    local_18 = (undefined8 *)(*(long *)(in_RDI + 0x38) + 0x1c);
  }
  else {
    local_18 = (undefined8 *)
               (*(long *)(in_RDI + 0x60) + (long)(*(int *)(in_RDI + 0x58) + -1) * 0x10);
  }
  *(undefined8 *)(in_RDI + 0x88) = *local_18;
  *(undefined8 *)(in_RDI + 0x90) = local_18[1];
  _OnChangedClipRect(unaff_retaddr);
  return;
}

Assistant:

void ImDrawList::PopClipRect()
{
    _ClipRectStack.pop_back();
    _CmdHeader.ClipRect = (_ClipRectStack.Size == 0) ? _Data->ClipRectFullscreen : _ClipRectStack.Data[_ClipRectStack.Size - 1];
    _OnChangedClipRect();
}